

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analog.cpp
# Opt level: O0

FloatSample __thiscall
MT32Emu::AccurateLowPassFilter::process(AccurateLowPassFilter *this,FloatSample inSample)

{
  uint uVar1;
  float local_2c;
  uint local_20;
  uint local_1c;
  uint delaySampleIx;
  uint tapIx;
  FloatSample sample;
  FloatSample inSample_local;
  AccurateLowPassFilter *this_local;
  
  if (this->phase == 0) {
    local_2c = this->LPF_TAPS[0x30] * this->ringBuffer[this->ringBufferPosition];
  }
  else {
    local_2c = 0.0;
  }
  delaySampleIx = (uint)local_2c;
  uVar1 = (*(this->super_AbstractLowPassFilter<int>)._vptr_AbstractLowPassFilter[3])();
  if ((uVar1 & 1) == 0) {
    this->ringBuffer[this->ringBufferPosition] = inSample;
  }
  local_1c = this->phase;
  for (local_20 = 0; local_20 < 0x10; local_20 = local_20 + 1) {
    delaySampleIx =
         (uint)(this->LPF_TAPS[local_1c] *
                this->ringBuffer[local_20 + this->ringBufferPosition & 0xf] + (float)delaySampleIx);
    local_1c = local_1c + 3;
  }
  this->phase = this->phaseIncrement + this->phase;
  if (2 < this->phase) {
    this->phase = this->phase - 3;
    this->ringBufferPosition = this->ringBufferPosition - 1 & 0xf;
  }
  return (float)delaySampleIx * 3.0;
}

Assistant:

FloatSample AccurateLowPassFilter::process(const FloatSample inSample) {
	static const unsigned int DELAY_LINE_MASK = ACCURATE_LPF_DELAY_LINE_LENGTH - 1;

	FloatSample sample = (phase == 0) ? LPF_TAPS[ACCURATE_LPF_DELAY_LINE_LENGTH * ACCURATE_LPF_NUMBER_OF_PHASES] * ringBuffer[ringBufferPosition] : 0.0f;
	if (!hasNextSample()) {
		ringBuffer[ringBufferPosition] = inSample;
	}

	for (unsigned int tapIx = phase, delaySampleIx = 0; delaySampleIx < ACCURATE_LPF_DELAY_LINE_LENGTH; delaySampleIx++, tapIx += ACCURATE_LPF_NUMBER_OF_PHASES) {
		sample += LPF_TAPS[tapIx] * ringBuffer[(delaySampleIx + ringBufferPosition) & DELAY_LINE_MASK];
	}

	phase += phaseIncrement;
	if (ACCURATE_LPF_NUMBER_OF_PHASES <= phase) {
		phase -= ACCURATE_LPF_NUMBER_OF_PHASES;
		ringBufferPosition = (ringBufferPosition - 1) & DELAY_LINE_MASK;
	}

	return ACCURATE_LPF_NUMBER_OF_PHASES * sample;
}